

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# izmax1.c
# Opt level: O1

int izmax1_slu(int *n,doublecomplex *cx,int *incx)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar5;
  doublecomplex *pdVar6;
  uint uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  ulong uVar4;
  
  uVar1 = *n;
  if ((int)uVar1 < 1) {
    return 0;
  }
  uVar4 = 1;
  uVar3 = 1;
  if (uVar1 != 1) {
    iVar2 = *incx;
    if ((long)iVar2 == 1) {
      dVar9 = ABS(cx->r);
      pdVar6 = cx + 1;
      uVar5 = 2;
      do {
        dVar10 = ABS(pdVar6->r);
        if (dVar9 < dVar10) {
          uVar4 = uVar5 & 0xffffffff;
        }
        uVar3 = (uint)uVar4;
        dVar9 = (double)(~-(ulong)(dVar9 < dVar10) & (ulong)dVar9 |
                        (ulong)dVar10 & -(ulong)(dVar9 < dVar10));
        uVar5 = uVar5 + 1;
        pdVar6 = pdVar6 + 1;
      } while ((ulong)uVar1 + 1 != uVar5);
    }
    else {
      dVar9 = ABS(cx->r);
      pdVar6 = cx + (long)(iVar2 + 1) + -1;
      uVar3 = 1;
      uVar7 = 2;
      do {
        dVar10 = ABS(pdVar6->r);
        if (dVar9 < dVar10) {
          uVar3 = uVar7;
        }
        dVar9 = (double)(~-(ulong)(dVar9 < dVar10) & (ulong)dVar9 |
                        (ulong)dVar10 & -(ulong)(dVar9 < dVar10));
        pdVar6 = pdVar6 + iVar2;
        bVar8 = uVar7 != uVar1;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
  }
  return uVar3;
}

Assistant:

int
izmax1_slu(int *n, doublecomplex *cx, int *incx)
{


    /* System generated locals */
    int ret_val;
    double d__1;
    
    /* Local variables */
    double smax;
    int i, ix;

#define CX(I) cx[(I)-1]

    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (d__1 = CX(1).r, fabs(d__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(ix).r, fabs(d__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (d__1 = CX(ix).r, fabs(d__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (d__1 = CX(1).r, fabs(d__1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = CX(i).r, fabs(d__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (d__1 = CX(i).r, fabs(d__1));
L40:
	;
    }
    return ret_val;

/*     End of IZMAX1 */

}